

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool __thiscall
Catch::RunContext::sectionStarted(RunContext *this,SectionInfo *sectionInfo,Counts *assertions)

{
  TestCaseTracker *this_00;
  IStreamingReporter *pIVar1;
  size_t sVar2;
  bool bVar3;
  ostream *poVar4;
  ostringstream oss;
  string local_1c0;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,(sectionInfo->name)._M_dataplus._M_p,
                      (sectionInfo->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"@",1);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(sectionInfo->lineInfo).file._M_dataplus._M_p,
                      (sectionInfo->lineInfo).file._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  this_00 = (this->m_testCaseTracker).nullableValue;
  std::__cxx11::stringbuf::str();
  bVar3 = SectionTracking::TestCaseTracker::enterSection(this_00,&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  if (bVar3) {
    std::__cxx11::string::_M_assign((string *)&(this->m_lastAssertionInfo).lineInfo);
    (this->m_lastAssertionInfo).lineInfo.line = (sectionInfo->lineInfo).line;
    pIVar1 = (this->m_reporter).m_p;
    (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[9])(pIVar1,sectionInfo);
    sVar2 = (this->m_totals).assertions.failed;
    assertions->passed = (this->m_totals).assertions.passed;
    assertions->failed = sVar2;
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return bVar3;
}

Assistant:

virtual bool sectionStarted (
            SectionInfo const& sectionInfo,
            Counts& assertions
        )
        {
            std::ostringstream oss;
            oss << sectionInfo.name << "@" << sectionInfo.lineInfo;

            if( !m_testCaseTracker->enterSection( oss.str() ) )
                return false;

            m_lastAssertionInfo.lineInfo = sectionInfo.lineInfo;

            m_reporter->sectionStarting( sectionInfo );

            assertions = m_totals.assertions;

            return true;
        }